

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateRecorder::Impl::copy_raytracing_pipeline
          (Impl *this,VkRayTracingPipelineCreateInfoKHR *create_info,ScratchAllocator *alloc,
          VkPipeline *base_pipelines,uint32_t base_pipeline_count,VkDevice device,
          PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii,
          VkRayTracingPipelineCreateInfoKHR **out_info)

{
  bool bVar1;
  VkPipelineCreateFlags2KHR VVar2;
  VkPipelineCreateFlags2CreateInfo *pVVar3;
  VkPipeline_T **ppVVar4;
  VkRayTracingShaderGroupCreateInfoKHR *pVVar5;
  void *local_60;
  void *pNext;
  VkRayTracingShaderGroupCreateInfoKHR *group;
  VkRayTracingPipelineCreateInfoKHR *pVStack_48;
  uint32_t i;
  VkRayTracingPipelineCreateInfoKHR *info;
  VkDevice device_local;
  VkPipeline *ppVStack_30;
  uint32_t base_pipeline_count_local;
  VkPipeline *base_pipelines_local;
  ScratchAllocator *alloc_local;
  VkRayTracingPipelineCreateInfoKHR *create_info_local;
  Impl *this_local;
  
  info = (VkRayTracingPipelineCreateInfoKHR *)device;
  device_local._4_4_ = base_pipeline_count;
  ppVStack_30 = base_pipelines;
  base_pipelines_local = (VkPipeline *)alloc;
  alloc_local = (ScratchAllocator *)create_info;
  create_info_local = (VkRayTracingPipelineCreateInfoKHR *)this;
  pVStack_48 = copy<VkRayTracingPipelineCreateInfoKHR>(this,create_info,1,alloc);
  VVar2 = normalize_pipeline_creation_flags((ulong)pVStack_48->flags);
  pVStack_48->flags = (VkPipelineCreateFlags)VVar2;
  pVVar3 = find_pnext<VkPipelineCreateFlags2CreateInfo>
                     (VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO,pVStack_48->pNext);
  if (pVVar3 != (VkPipelineCreateFlags2CreateInfo *)0x0) {
    pVStack_48->flags = 0;
  }
  bVar1 = update_derived_pipeline<VkRayTracingPipelineCreateInfoKHR>
                    (pVStack_48,ppVStack_30,device_local._4_4_);
  if (bVar1) {
    bVar1 = copy_stages<VkRayTracingPipelineCreateInfoKHR>
                      (this,pVStack_48,(ScratchAllocator *)base_pipelines_local,(VkDevice)info,
                       gsmcii,(DynamicStateInfo *)0x0);
    if (bVar1) {
      bVar1 = copy_dynamic_state<VkRayTracingPipelineCreateInfoKHR>
                        (this,pVStack_48,(ScratchAllocator *)base_pipelines_local,
                         (DynamicStateInfo *)0x0);
      if (bVar1) {
        bVar1 = copy_sub_create_info<VkPipelineLibraryCreateInfoKHR>
                          (this,&pVStack_48->pLibraryInfo,(ScratchAllocator *)base_pipelines_local,
                           (DynamicStateInfo *)0x0,0);
        if (bVar1) {
          bVar1 = copy_sub_create_info<VkRayTracingPipelineInterfaceCreateInfoKHR>
                            (this,&pVStack_48->pLibraryInterface,
                             (ScratchAllocator *)base_pipelines_local,(DynamicStateInfo *)0x0,0);
          if (bVar1) {
            if (pVStack_48->pLibraryInfo != (VkPipelineLibraryCreateInfoKHR *)0x0) {
              ppVVar4 = copy<VkPipeline_T*>(this,pVStack_48->pLibraryInfo->pLibraries,
                                            (ulong)pVStack_48->pLibraryInfo->libraryCount,
                                            (ScratchAllocator *)base_pipelines_local);
              pVStack_48->pLibraryInfo->pLibraries = ppVVar4;
            }
            pVVar5 = copy<VkRayTracingShaderGroupCreateInfoKHR>
                               (this,pVStack_48->pGroups,(ulong)pVStack_48->groupCount,
                                (ScratchAllocator *)base_pipelines_local);
            pVStack_48->pGroups = pVVar5;
            for (group._4_4_ = 0; group._4_4_ < pVStack_48->groupCount;
                group._4_4_ = group._4_4_ + 1) {
              pNext = pVStack_48->pGroups + group._4_4_;
              local_60 = (void *)0x0;
              bVar1 = copy_pnext_chain(this,((VkRayTracingShaderGroupCreateInfoKHR *)pNext)->pNext,
                                       (ScratchAllocator *)base_pipelines_local,&local_60,
                                       (DynamicStateInfo *)0x0,0);
              if (!bVar1) {
                return false;
              }
              *(void **)((long)pNext + 8) = local_60;
              *(undefined8 *)((long)pNext + 0x28) = 0;
            }
            bVar1 = copy_pnext_chain(this,pVStack_48->pNext,(ScratchAllocator *)base_pipelines_local
                                     ,&pVStack_48->pNext,(DynamicStateInfo *)0x0,0);
            if (bVar1) {
              *out_info = pVStack_48;
              this_local._7_1_ = true;
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool StateRecorder::Impl::copy_raytracing_pipeline(const VkRayTracingPipelineCreateInfoKHR *create_info,
                                                   ScratchAllocator &alloc, const VkPipeline *base_pipelines,
                                                   uint32_t base_pipeline_count,
                                                   VkDevice device, PFN_vkGetShaderModuleCreateInfoIdentifierEXT gsmcii,
                                                   VkRayTracingPipelineCreateInfoKHR **out_info)
{
	auto *info = copy(create_info, 1, alloc);
	info->flags = normalize_pipeline_creation_flags(info->flags);
	if (find_pnext<VkPipelineCreateFlags2CreateInfoKHR>(VK_STRUCTURE_TYPE_PIPELINE_CREATE_FLAGS_2_CREATE_INFO_KHR, info->pNext))
		info->flags = 0;

	if (!update_derived_pipeline(info, base_pipelines, base_pipeline_count))
		return false;

	if (!copy_stages(info, alloc, device, gsmcii, nullptr))
		return false;
	if (!copy_dynamic_state(info, alloc, nullptr))
		return false;

	if (!copy_sub_create_info(info->pLibraryInfo, alloc, nullptr, 0))
		return false;
	if (!copy_sub_create_info(info->pLibraryInterface, alloc, nullptr, 0))
		return false;

	if (info->pLibraryInfo)
	{
		const_cast<VkPipelineLibraryCreateInfoKHR *>(info->pLibraryInfo)->pLibraries =
				copy(info->pLibraryInfo->pLibraries, info->pLibraryInfo->libraryCount, alloc);
	}

	info->pGroups = copy(info->pGroups, info->groupCount, alloc);
	for (uint32_t i = 0; i < info->groupCount; i++)
	{
		auto &group = const_cast<VkRayTracingShaderGroupCreateInfoKHR &>(info->pGroups[i]);
		const void *pNext = nullptr;
		if (!copy_pnext_chain(group.pNext, alloc, &pNext, nullptr, 0))
			return false;
		group.pNext = pNext;
		group.pShaderGroupCaptureReplayHandle = nullptr;
	}

	if (!copy_pnext_chain(info->pNext, alloc, &info->pNext, nullptr, 0))
		return false;

	*out_info = info;
	return true;
}